

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::anon_unknown_0::FullErrorString
                   (string *__return_storage_ptr__,string *name,int line_num,string *msg)

{
  AlphaNum *a;
  AlphaNum local_130;
  string local_100;
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *msg_local;
  string *psStack_18;
  int line_num_local;
  string *name_local;
  
  local_28 = msg;
  msg_local._4_4_ = line_num;
  psStack_18 = name;
  name_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"error: ",&local_c9);
  std::operator+(&local_a8,&local_c8,psStack_18);
  std::operator+(&local_88,&local_a8," Line ");
  strings::AlphaNum::AlphaNum(&local_130,msg_local._4_4_);
  StrCat_abi_cxx11_(&local_100,(protobuf *)&local_130,a);
  std::operator+(&local_68,&local_88,&local_100);
  std::operator+(&local_48,&local_68,", ");
  std::operator+(__return_storage_ptr__,&local_48,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  return __return_storage_ptr__;
}

Assistant:

std::string FullErrorString(const std::string& name, int line_num, const std::string& msg) {
  return std::string("error: ") + name + " Line " + StrCat(line_num) + ", " + msg;
}